

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta.cpp
# Opt level: O3

MPP_RET mpp_meta_get_with_tag(MppMeta *meta,char *tag,char *caller)

{
  MPP_RET MVar1;
  MppMetaService *this;
  MppMetaImpl *pMVar2;
  
  if (meta == (MppMeta *)0x0) {
    _mpp_log_l(2,"mpp_meta","found NULL input\n","mpp_meta_get_with_tag");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    this = MppMetaService::get_inst();
    pMVar2 = MppMetaService::get_meta(this,tag,caller);
    *meta = pMVar2;
    MVar1 = -(uint)(pMVar2 == (MppMetaImpl *)0x0);
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_meta_get_with_tag(MppMeta *meta, const char *tag, const char *caller)
{
    if (NULL == meta) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppMetaService *service = MppMetaService::get_inst();
    MppMetaImpl *impl = service->get_meta(tag, caller);
    *meta = (MppMeta) impl;
    return (impl) ? (MPP_OK) : (MPP_NOK);
}